

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_ed68e::DepsLogTestReverseDepsNodes::~DepsLogTestReverseDepsNodes
          (DepsLogTestReverseDepsNodes *this)

{
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(DepsLogTest, ReverseDepsNodes) {
  State state;
  DepsLog log;
  string err;
  EXPECT_TRUE(log.OpenForWrite(kTestFilename, &err));
  ASSERT_EQ("", err);

  vector<Node*> deps;
  deps.push_back(state.GetNode("foo.h", 0));
  deps.push_back(state.GetNode("bar.h", 0));
  log.RecordDeps(state.GetNode("out.o", 0), 1, deps);

  deps.clear();
  deps.push_back(state.GetNode("foo.h", 0));
  deps.push_back(state.GetNode("bar2.h", 0));
  log.RecordDeps(state.GetNode("out2.o", 0), 2, deps);

  log.Close();

  Node* rev_deps = log.GetFirstReverseDepsNode(state.GetNode("foo.h", 0));
  EXPECT_TRUE(rev_deps == state.GetNode("out.o", 0) ||
              rev_deps == state.GetNode("out2.o", 0));

  rev_deps = log.GetFirstReverseDepsNode(state.GetNode("bar.h", 0));
  EXPECT_TRUE(rev_deps == state.GetNode("out.o", 0));
}